

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O3

void __thiscall
soplex::SPxSolverBase<double>::getLeaveVals
          (SPxSolverBase<double> *this,int leaveIdx,Status *leaveStat,SPxId *leaveId,
          double *leaveMax,double *leavebound,int *leaveNum,StableSum<double> *objChange)

{
  SPxBasisBase<double> *this_00;
  double dVar1;
  DataKey DVar2;
  double dVar3;
  int iVar4;
  Status SVar5;
  pointer pdVar6;
  double *pdVar7;
  pointer pdVar8;
  undefined8 *puVar9;
  Status *pSVar10;
  double dVar11;
  double dVar12;
  DataKey local_50;
  long local_48;
  undefined1 local_40 [16];
  
  this_00 = &this->super_SPxBasisBase<double>;
  DVar2 = (this->super_SPxBasisBase<double>).theBaseId.data[leaveIdx].super_DataKey;
  leaveId->super_DataKey = DVar2;
  if (-1 < DVar2.info) {
    SPxColId::SPxColId((SPxColId *)&local_50,leaveId);
    iVar4 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                        super_SVSetBase<double>.set,&local_50);
    *leaveNum = iVar4;
    pSVar10 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
    SVar5 = pSVar10[iVar4];
    *leaveStat = SVar5;
    switch(SVar5) {
    case D_FREE:
      pSVar10[iVar4] = P_FIXED;
      dVar11 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar4];
      *leavebound = dVar11;
      dVar11 = dVar11 * (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar4];
      dVar12 = objChange->sum;
      dVar1 = dVar12 + dVar11;
      objChange->c = (dVar11 - (dVar1 - dVar12)) + (dVar12 - (dVar1 - (dVar1 - dVar12))) +
                     objChange->c;
      objChange->sum = dVar1;
LAB_001e3d52:
      dVar11 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[leaveIdx];
      pdVar7 = (this->theFvec->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + leaveIdx;
      if (*pdVar7 <= dVar11 && dVar11 != *pdVar7) break;
      goto code_r0x001e3d7d;
    case D_ON_UPPER:
      pSVar10[iVar4] = P_ON_LOWER;
      dVar11 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar4];
      *leavebound = dVar11;
      dVar11 = dVar11 * (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar4];
      dVar12 = objChange->sum;
      dVar1 = dVar12 + dVar11;
      objChange->c = (dVar11 - (dVar1 - dVar12)) + (dVar12 - (dVar1 - (dVar1 - dVar12))) +
                     objChange->c;
      objChange->sum = dVar1;
      break;
    case D_ON_LOWER:
      pSVar10[iVar4] = P_ON_UPPER;
      dVar11 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar4];
      *leavebound = dVar11;
      dVar11 = dVar11 * (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar4];
      dVar12 = objChange->sum;
      dVar1 = dVar12 + dVar11;
      objChange->c = (dVar11 - (dVar1 - dVar12)) + (dVar12 - (dVar1 - (dVar1 - dVar12))) +
                     objChange->c;
      objChange->sum = dVar1;
      goto code_r0x001e3d7d;
    case D_ON_BOTH:
      dVar11 = (this->theFvec->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[leaveIdx];
      pdVar7 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + leaveIdx;
      if (*pdVar7 <= dVar11 && dVar11 != *pdVar7) {
        ::soplex::infinity::__tls_init();
        iVar4 = *leaveNum;
        pdVar7 = (double *)__tls_get_addr(&PTR_003b4b70);
        dVar11 = *pdVar7;
        *leaveMax = -dVar11;
        dVar12 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[iVar4];
        *leavebound = dVar12;
        dVar12 = dVar12 * (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar4];
        dVar1 = objChange->sum;
        dVar3 = dVar1 + dVar12;
        objChange->c = (dVar12 - (dVar3 - dVar1)) + (dVar1 - (dVar3 - (dVar3 - dVar1))) +
                       objChange->c;
        objChange->sum = dVar3;
        ::soplex::infinity::__tls_init();
        iVar4 = *leaveNum;
        (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar4] = -dVar11;
        (this->super_SPxBasisBase<double>).thedesc.colstat.data[iVar4] = P_ON_UPPER;
        return;
      }
      ::soplex::infinity::__tls_init();
      iVar4 = *leaveNum;
      pdVar7 = (double *)__tls_get_addr(&PTR_003b4b70);
      dVar11 = *pdVar7;
      *leaveMax = dVar11;
      dVar12 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar4];
      *leavebound = dVar12;
      dVar12 = dVar12 * (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar4];
      dVar1 = objChange->sum;
      dVar3 = dVar1 + dVar12;
      objChange->c = (dVar12 - (dVar3 - dVar1)) + (dVar1 - (dVar3 - (dVar3 - dVar1))) + objChange->c
      ;
      objChange->sum = dVar3;
      ::soplex::infinity::__tls_init();
      iVar4 = *leaveNum;
      (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar4] = dVar11;
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[iVar4] = P_ON_LOWER;
      return;
    case P_ON_LOWER:
      SVar5 = SPxBasisBase<double>::dualColStatus(this_00,iVar4);
      iVar4 = *leaveNum;
      pSVar10 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001e39d7:
      pSVar10[iVar4] = SVar5;
      *leavebound = 0.0;
      break;
    default:
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_50 = (DataKey)local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"XLEAVE03 This should never happen.","");
      *puVar9 = &PTR__SPxException_003adbd8;
      puVar9[1] = puVar9 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 1),local_50,(undefined1 *)(local_48 + (long)local_50));
      *puVar9 = &PTR__SPxException_003ae9a0;
      __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_UPPER:
      SVar5 = SPxBasisBase<double>::dualColStatus(this_00,iVar4);
      iVar4 = *leaveNum;
      pSVar10 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001e3c27:
      pSVar10[iVar4] = SVar5;
      *leavebound = 0.0;
code_r0x001e3d7d:
      ::soplex::infinity::__tls_init();
      pdVar7 = (double *)__tls_get_addr(&PTR_003b4b70);
      *leaveMax = -*pdVar7;
      return;
    case P_FREE:
      SVar5 = SPxBasisBase<double>::dualColStatus(this_00,iVar4);
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[*leaveNum] = SVar5;
      dVar11 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[leaveIdx];
      pdVar7 = (this->theFvec->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + leaveIdx;
      if (*pdVar7 <= dVar11 && dVar11 != *pdVar7) {
        *leavebound = dVar11;
        goto code_r0x001e3d7d;
      }
      *leavebound = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[leaveIdx];
    }
    ::soplex::infinity::__tls_init();
    pdVar7 = (double *)__tls_get_addr(&PTR_003b4b70);
    *leaveMax = *pdVar7;
    return;
  }
  SPxRowId::SPxRowId((SPxRowId *)&local_50,leaveId);
  iVar4 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                    (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                      super_SVSetBase<double>.set,&local_50);
  *leaveNum = iVar4;
  pSVar10 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
  SVar5 = pSVar10[iVar4];
  *leaveStat = SVar5;
  switch(SVar5) {
  case D_FREE:
    pSVar10[iVar4] = P_FIXED;
    *leavebound = -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar4];
    goto LAB_001e3d52;
  case D_ON_UPPER:
    pSVar10[iVar4] = P_ON_LOWER;
    *leavebound = -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar4];
    ::soplex::infinity::__tls_init();
    iVar4 = *leaveNum;
    pdVar8 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar7 = (double *)__tls_get_addr(&PTR_003b4b70);
    *leaveMax = -*pdVar7;
    pdVar6 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    break;
  case D_ON_LOWER:
    pSVar10[iVar4] = P_ON_UPPER;
    *leavebound = -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar4];
    ::soplex::infinity::__tls_init();
    iVar4 = *leaveNum;
    pdVar8 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar7 = (double *)__tls_get_addr(&PTR_003b4b70);
    *leaveMax = *pdVar7;
    pdVar6 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    break;
  case D_ON_BOTH:
    dVar11 = (this->theFvec->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[leaveIdx];
    pdVar7 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + leaveIdx;
    if (dVar11 < *pdVar7 || dVar11 == *pdVar7) {
      pSVar10[iVar4] = P_ON_UPPER;
      ::soplex::infinity::__tls_init();
      iVar4 = *leaveNum;
      pdVar7 = (double *)__tls_get_addr(&PTR_003b4b70);
      dVar11 = *pdVar7;
      (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar4] = dVar11;
      *leavebound = -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar4];
      ::soplex::infinity::__tls_init();
      iVar4 = *leaveNum;
      pdVar8 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      *leaveMax = dVar11;
      pdVar6 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    else {
      pSVar10[iVar4] = P_ON_LOWER;
      ::soplex::infinity::__tls_init();
      iVar4 = *leaveNum;
      pdVar7 = (double *)__tls_get_addr(&PTR_003b4b70);
      dVar11 = *pdVar7;
      (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar4] = -dVar11;
      *leavebound = -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar4];
      ::soplex::infinity::__tls_init();
      iVar4 = *leaveNum;
      pdVar8 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      *leaveMax = -dVar11;
      pdVar6 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    dVar11 = pdVar6[iVar4] * pdVar8[iVar4];
    goto LAB_001e3f2a;
  case P_ON_LOWER:
    SVar5 = SPxBasisBase<double>::dualRowStatus(this_00,iVar4);
    iVar4 = *leaveNum;
    pSVar10 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
    goto LAB_001e39d7;
  default:
    puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_50 = (DataKey)local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"XLEAVE02 This should never happen.","");
    *puVar9 = &PTR__SPxException_003adbd8;
    puVar9[1] = puVar9 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar9 + 1),local_50,(undefined1 *)(local_48 + (long)local_50));
    *puVar9 = &PTR__SPxException_003ae9a0;
    __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_UPPER:
    SVar5 = SPxBasisBase<double>::dualRowStatus(this_00,iVar4);
    iVar4 = *leaveNum;
    pSVar10 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
    goto LAB_001e3c27;
  case P_FREE:
    puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_50 = (DataKey)local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"XLEAVE01 This should never happen.","");
    *puVar9 = &PTR__SPxException_003adbd8;
    puVar9[1] = puVar9 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar9 + 1),local_50,(undefined1 *)(local_48 + (long)local_50));
    *puVar9 = &PTR__SPxException_003ae9a0;
    __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  dVar11 = pdVar6[iVar4] * pdVar8[iVar4];
LAB_001e3f2a:
  dVar12 = objChange->sum;
  dVar1 = dVar12 + dVar11;
  objChange->c = (dVar11 - (dVar1 - dVar12)) + (dVar12 - (dVar1 - (dVar1 - dVar12))) + objChange->c;
  objChange->sum = dVar1;
  return;
}

Assistant:

void SPxSolverBase<R>::getLeaveVals(
   int leaveIdx,
   typename SPxBasisBase<R>::Desc::Status& leaveStat,
   SPxId& leaveId,
   R& leaveMax,
   R& leavebound,
   int& leaveNum,
   StableSum<R>& objChange)
{
   typename SPxBasisBase<R>::Desc& ds = this->desc();
   leaveId = this->baseId(leaveIdx);

   if(leaveId.isSPxRowId())
   {
      leaveNum = this->number(SPxRowId(leaveId));
      leaveStat = ds.rowStatus(leaveNum);

      assert(isBasic(leaveStat));

      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         ds.rowStatus(leaveNum) = this->dualRowStatus(leaveNum);
         leavebound = 0;
         leaveMax = R(-infinity);
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         ds.rowStatus(leaveNum) = this->dualRowStatus(leaveNum);
         leavebound = 0;
         leaveMax = R(infinity);
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);
         throw SPxInternalCodeException("XLEAVE01 This should never happen.");

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);
         ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_FIXED;
         assert(this->lhs(leaveNum) == this->rhs(leaveNum));
         leavebound = -this->rhs(leaveNum);

         if((*theFvec)[leaveIdx] < theLBbound[leaveIdx])
            leaveMax = R(infinity);
         else
            leaveMax = R(-infinity);

         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         leavebound = -this->rhs(leaveNum);                // slack !!
         leaveMax = R(infinity);
         objChange += theLRbound[leaveNum] * this->rhs(leaveNum);
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         leavebound = -this->lhs(leaveNum);                // slack !!
         leaveMax = R(-infinity);
         objChange += theURbound[leaveNum] * this->lhs(leaveNum);
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == COLUMN);

         if((*theFvec)[leaveIdx] > theLBbound[leaveIdx])
         {
            ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            theLRbound[leaveNum] = R(-infinity);
            leavebound = -this->lhs(leaveNum);            // slack !!
            leaveMax = R(-infinity);
            objChange += theURbound[leaveNum] * this->lhs(leaveNum);
         }
         else
         {
            ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            theURbound[leaveNum] = R(infinity);
            leavebound = -this->rhs(leaveNum);            // slack !!
            leaveMax = R(infinity);
            objChange += theLRbound[leaveNum] * this->rhs(leaveNum);
         }

         break;

      default:
         throw SPxInternalCodeException("XLEAVE02 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE51 SPxSolverBase<R>::getLeaveVals() : row {} : {} -> {} objChange: {}\n",
                    leaveNum, leaveStat, ds.rowStatus(leaveNum), objChange);
   }

   else
   {
      assert(leaveId.isSPxColId());
      leaveNum = this->number(SPxColId(leaveId));
      leaveStat = ds.colStatus(leaveNum);

      assert(isBasic(leaveStat));

      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         ds.colStatus(leaveNum) = this->dualColStatus(leaveNum);
         leavebound = 0;
         leaveMax = R(-infinity);
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         ds.colStatus(leaveNum) = this->dualColStatus(leaveNum);
         leavebound = 0;
         leaveMax = R(infinity);
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);
         ds.colStatus(leaveNum) = this->dualColStatus(leaveNum);

         if((*theFvec)[leaveIdx] < theLBbound[leaveIdx])
         {
            leavebound = theLBbound[leaveIdx];
            leaveMax = R(-infinity);
         }
         else
         {
            leavebound = theUBbound[leaveIdx];
            leaveMax = R(infinity);
         }

         break;

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);
         assert(SPxLPBase<R>::upper(leaveNum) == SPxLPBase<R>::lower(leaveNum));
         ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_FIXED;
         leavebound = SPxLPBase<R>::upper(leaveNum);
         objChange += this->maxObj(leaveNum) * leavebound;

         if((*theFvec)[leaveIdx] < theLBbound[leaveIdx])
            leaveMax = R(infinity);
         else
            leaveMax = R(-infinity);

         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         leavebound = SPxLPBase<R>::upper(leaveNum);
         objChange += theUCbound[leaveNum] * leavebound;
         leaveMax = R(-infinity);
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         leavebound = SPxLPBase<R>::lower(leaveNum);
         objChange += theLCbound[leaveNum] * leavebound;
         leaveMax = R(infinity);
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == COLUMN);

         if((*theFvec)[leaveIdx] > theUBbound[leaveIdx])
         {
            leaveMax = R(-infinity);
            leavebound = SPxLPBase<R>::upper(leaveNum);
            objChange += theUCbound[leaveNum] * leavebound;
            theLCbound[leaveNum] = R(-infinity);
            ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            leaveMax = R(infinity);
            leavebound = SPxLPBase<R>::lower(leaveNum);
            objChange += theLCbound[leaveNum] * leavebound;
            theUCbound[leaveNum] = R(infinity);
            ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         break;

      default:
         throw SPxInternalCodeException("XLEAVE03 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE52 SPxSolverBase<R>::getLeaveVals() : col {} : {} -> {} objChange: {}\n",
                    leaveNum, leaveStat, ds.colStatus(leaveNum), objChange);
   }
}